

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O3

void xe::removeEmptyGroups
               (set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                *nodeSet,TestGroup *group)

{
  pointer ppTVar1;
  TestNode *pTVar2;
  TestGroup *group_00;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
  *psVar6;
  set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
  *psVar7;
  bool bVar8;
  pair<std::_Rb_tree_iterator<const_xe::TestNode_*>,_std::_Rb_tree_iterator<const_xe::TestNode_*>_>
  pVar9;
  TestGroup *local_20;
  
  ppTVar1 = (group->m_children).super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar3 = (uint)((ulong)((long)(group->m_children).
                               super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1) >> 3);
  if (0 < (int)uVar3) {
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    bVar8 = true;
    uVar5 = 0;
    do {
      if (*(set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
            **)(nodeSet + 0x10) !=
          (set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
           *)0x0) {
        pTVar2 = ppTVar1[uVar5];
        psVar6 = nodeSet + 8;
        psVar7 = *(set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                   **)(nodeSet + 0x10);
        do {
          if (*(TestNode **)(psVar7 + 0x20) >= pTVar2) {
            psVar6 = psVar7;
          }
          psVar7 = *(set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                     **)(psVar7 + (ulong)(*(TestNode **)(psVar7 + 0x20) < pTVar2) * 8 + 0x10);
        } while (psVar7 != (set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                            *)0x0);
        if ((psVar6 != nodeSet + 8) && (*(TestNode **)(psVar6 + 0x20) <= pTVar2)) break;
      }
      uVar5 = uVar5 + 1;
      bVar8 = uVar5 < uVar4;
    } while (uVar5 != uVar4);
    if (bVar8) {
      return;
    }
  }
  local_20 = group;
  pVar9 = std::
          _Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
          ::equal_range((_Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                         *)nodeSet,(key_type *)&local_20);
  std::
  _Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
  ::_M_erase_aux((_Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                  *)nodeSet,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
  group_00 = (group->super_TestNode).m_parent;
  if (group_00 != (TestGroup *)0x0) {
    removeEmptyGroups(nodeSet,group_00);
  }
  return;
}

Assistant:

static void removeEmptyGroups (std::set<const TestNode*>& nodeSet, const TestGroup* group)
{
	if (!hasChildrenInSet(nodeSet, group))
	{
		nodeSet.erase(group);
		if (group->getParent() != DE_NULL)
			removeEmptyGroups(nodeSet, group->getParent());
	}
}